

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O2

Status __thiscall
google::protobuf::json_internal::JsonLocation::Invalid
          (JsonLocation *this,unsigned_long *param_2,size_t param_3,char *param_4)

{
  char cVar1;
  type_conflict6 tVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  bool bVar6;
  char local_e1;
  string to_obfuscate;
  uint64_t kA;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  string status_message;
  string_view message_local;
  uint64_t state;
  uint64_t kB;
  anon_class_24_3_0cb2199b rng;
  
  message_local._M_len = param_3;
  message_local._M_str = param_4;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&status_message,"invalid JSON",(allocator<char> *)&rng);
  to_obfuscate._M_dataplus._M_p = (pointer)&to_obfuscate.field_2;
  to_obfuscate._M_string_length = 0;
  to_obfuscate.field_2._M_local_buf[0] = '\0';
  if (param_2[3] != 0) {
    rng._0_16_ = absl::lts_20240722::NullSafeStringView(" in ");
    absl::lts_20240722::StrAppend((string *)&to_obfuscate,(AlphaNum *)&rng);
    MessagePath::Describe((MessagePath *)param_2[3],&to_obfuscate);
    std::__cxx11::string::push_back((char)&to_obfuscate);
  }
  rng.state = (uint64_t *)anon_var_dwarf_6a981b;
  rng.kA = (uint64_t *)0x1e;
  local_b0._M_len = param_2[1] + 1;
  kA = param_2[2] + 1;
  absl::lts_20240722::
  StrAppendFormat<unsigned_long,_unsigned_long,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>_>
            (&to_obfuscate,
             (FormatSpec<unsigned_long,_unsigned_long,_unsigned_long,_std::basic_string_view<char>_>
              *)&rng,&local_b0._M_len,&kA,param_2,&message_local);
  local_b0._M_len = to_obfuscate._M_string_length;
  local_b0._M_str = to_obfuscate._M_dataplus._M_p;
  kA = 0x5851f42d4c957f2d;
  rng.kB = &kB;
  kB = 0x14057b7ef767814f;
  LOCK();
  UNLOCK();
  state = (anonymous_namespace)::
          HardenAgainstHyrumsLaw(std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&)
          ::kCounterSeed + 0x14057b7ef7b284ff;
  rng.kA = &kA;
  rng.state = &state;
  (anonymous_namespace)::
  HardenAgainstHyrumsLaw(std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&)
  ::kCounterSeed =
       (anonymous_namespace)::
       HardenAgainstHyrumsLaw(std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&)
       ::kCounterSeed + 1;
  anon_unknown_1::HardenAgainstHyrumsLaw::anon_class_24_3_0cb2199b::operator()(&rng);
  local_e1 = ' ';
  absl::lts_20240722::c_count<std::basic_string_view<char,std::char_traits<char>>,char>
            (&local_b0,&local_e1);
  std::__cxx11::string::reserve((ulong)&status_message);
  pcVar3 = local_b0._M_str + local_b0._M_len;
  for (pcVar5 = local_b0._M_str; pcVar5 != pcVar3; pcVar5 = pcVar5 + 1) {
    cVar1 = *pcVar5;
    std::__cxx11::string::push_back((char)&status_message);
    if (cVar1 == ' ') {
      tVar2 = anon_unknown_1::HardenAgainstHyrumsLaw::anon_class_24_3_0cb2199b::operator()(&rng);
      if (tVar2 % 3 == 0) {
        tVar2 = anon_unknown_1::HardenAgainstHyrumsLaw::anon_class_24_3_0cb2199b::operator()(&rng);
        uVar4 = (ulong)((tVar2 & 1) + 1);
        while (bVar6 = uVar4 != 0, uVar4 = uVar4 - 1, bVar6) {
          std::__cxx11::string::push_back((char)&status_message);
        }
      }
    }
  }
  absl::lts_20240722::InvalidArgumentError
            (this,status_message._M_string_length,status_message._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&to_obfuscate);
  std::__cxx11::string::~string((string *)&status_message);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status JsonLocation::Invalid(absl::string_view message,
                                   SourceLocation sl) const {
  // NOTE: we intentionally do not harden the "invalid JSON" part, so that
  // people have a hope of grepping for it in logs. That part is easy to
  // commit to, as stability goes.
  //
  // This copies the error twice. Because this is the "unhappy" path, this
  // function is cold and can afford the waste.
  std::string status_message = "invalid JSON";
  std::string to_obfuscate;
  if (path != nullptr) {
    absl::StrAppend(&to_obfuscate, " in ");
    path->Describe(to_obfuscate);
    to_obfuscate.push_back(',');
  }
  absl::StrAppendFormat(&to_obfuscate, " near %zu:%zu (offset %zu): %s",
                        line + 1, col + 1, offset, message);
  HardenAgainstHyrumsLaw(to_obfuscate, status_message);

  return absl::InvalidArgumentError(std::move(status_message));
}